

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

uint64_t __thiscall
llvm::DataExtractor::getUnsigned
          (DataExtractor *this,uint64_t *offset_ptr,uint32_t byte_size,Error *Err)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint64_t uVar4;
  unsigned_long uVar5;
  
  switch(byte_size) {
  case 1:
    bVar1 = getU<unsigned_char>(offset_ptr,this,SUB81((this->Data).Data,0),(char *)Err,Err);
    uVar4 = (uint64_t)bVar1;
    break;
  case 2:
    uVar2 = getU<unsigned_short>(offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,Err)
    ;
    uVar4 = (uint64_t)uVar2;
    break;
  default:
    llvm_unreachable_internal
              ("getUnsigned unhandled case!",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
               ,0x88);
  case 4:
    uVar3 = getU<unsigned_int>(offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,Err);
    uVar4 = (uint64_t)uVar3;
    break;
  case 8:
    uVar5 = getU<unsigned_long>(offset_ptr,this,this->IsLittleEndian != '\0',(this->Data).Data,Err);
    return uVar5;
  }
  return uVar4;
}

Assistant:

uint64_t DataExtractor::getUnsigned(uint64_t *offset_ptr, uint32_t byte_size,
                                    llvm::Error *Err) const {
  switch (byte_size) {
  case 1:
    return getU8(offset_ptr, Err);
  case 2:
    return getU16(offset_ptr, Err);
  case 4:
    return getU32(offset_ptr, Err);
  case 8:
    return getU64(offset_ptr, Err);
  }
  llvm_unreachable("getUnsigned unhandled case!");
}